

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void write_N(ofstream *fout_N)

{
  ostream *poVar1;
  double N_ph;
  double N_p;
  double N_e;
  char local_41;
  double local_40;
  double local_38;
  double local_30;
  
  MPI_Reduce((long)psr._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0xb0,&local_30,1,
             &ompi_mpi_double,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  MPI_Reduce((long)psr._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0xb8,&local_38,1,
             &ompi_mpi_double,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  MPI_Reduce((long)psr._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0xc0,&local_40,1,
             &ompi_mpi_double,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  if (mpi_rank == 0) {
    poVar1 = std::ostream::_M_insert<double>(local_30);
    local_41 = '\t';
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_41,1);
    poVar1 = std::ostream::_M_insert<double>(local_38);
    local_41 = '\t';
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_41,1);
    poVar1 = std::ostream::_M_insert<double>(local_40);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  return;
}

Assistant:

void write_N(ofstream& fout_N)
{
    double N_e,N_p,N_ph;
    MPI_Reduce(&(psr->N_e), &N_e, 1, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
    MPI_Reduce(&(psr->N_p), &N_p, 1, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
    MPI_Reduce(&(psr->N_ph), &N_ph, 1, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
    if (mpi_rank == 0) {
        fout_N<<N_e<<'\t'<<N_p<<'\t'<<N_ph<<endl;
    }
}